

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O1

void __thiscall EvalParams::Deserialize(EvalParams *this,json *json)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  EvalContext *pEVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_39;
  EvalContext *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<EvalContext,std::allocator<EvalContext>>
            (&_Stack_30,&local_38,(allocator<EvalContext> *)&local_39);
  _Var3._M_pi = _Stack_30._M_pi;
  pEVar2 = local_38;
  local_38 = (EvalContext *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pEVar2;
  (this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  peVar1 = (this->ctx).super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_28,json);
  (*(peVar1->super_JsonProtocol)._vptr_JsonProtocol[3])(peVar1,&local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28);
  return;
}

Assistant:

void EvalParams::Deserialize(nlohmann::json json) {
	ctx = std::make_shared<EvalContext>();
	ctx->Deserialize(json);
}